

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_reply.c
# Opt level: O0

int mpt_context_reply(mpt_reply_context *rc,int code,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_248 [24];
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  int local_194;
  int len;
  int ret;
  mpt_msgtype mt;
  iovec cont;
  mpt_message msg;
  char buf [256];
  char *desc;
  char *ansi;
  va_list va;
  char *fmt_local;
  int code_local;
  mpt_reply_context *rc_local;
  
  if (in_AL != '\0') {
    local_218 = in_XMM0_Qa;
    local_208 = in_XMM1_Qa;
    local_1f8 = in_XMM2_Qa;
    local_1e8 = in_XMM3_Qa;
    local_1d8 = in_XMM4_Qa;
    local_1c8 = in_XMM5_Qa;
    local_1b8 = in_XMM6_Qa;
    local_1a8 = in_XMM7_Qa;
  }
  if ((code < -0x80) || (0x7f < code)) {
    rc_local._4_4_ = -1;
  }
  else {
    local_230 = in_RCX;
    local_228 = in_R8;
    local_220 = in_R9;
    if (rc == (mpt_reply_context *)0x0) {
      desc = (char *)0x0;
      if (fmt == (char *)0x0) {
        rc_local._4_4_ = 0;
      }
      else {
        if (code == 0) {
          fmt_local._4_4_ = 0x10;
        }
        else if (code < 1) {
          fmt_local._4_4_ = 3;
        }
        else {
          fmt_local._4_4_ = 8;
        }
        iVar1 = fileno(_stderr);
        iVar1 = isatty(iVar1);
        if ((0 < iVar1) && (desc = mpt_ansi_code((uint8_t)fmt_local._4_4_), desc != (char *)0x0)) {
          fputs(desc,_stderr);
        }
        fputc(0x5b,_stderr);
        if ((desc == (char *)0x0) &&
           (pcVar2 = mpt_log_identifier(fmt_local._4_4_), pcVar2 != (char *)0x0)) {
          fputs(pcVar2,_stderr);
        }
        fputc(0x3e,_stderr);
        fputc(0x5d,_stderr);
        fputc(0x20,_stderr);
        if (desc != (char *)0x0) {
          pcVar2 = mpt_ansi_reset();
          fputs(pcVar2,_stderr);
        }
        va[0].overflow_arg_area = local_248;
        va[0]._0_8_ = &stack0x00000008;
        ansi._4_4_ = 0x30;
        ansi._0_4_ = 0x18;
        vfprintf(_stderr,fmt,&ansi);
        fputc(10,_stderr);
        rc_local._4_4_ = 1;
      }
    }
    else {
      len._2_1_ = 1;
      len._3_1_ = (undefined1)code;
      msg.used = (long)&len + 2;
      cont.iov_len = 2;
      msg.cont = (iovec *)0x0;
      if (fmt != (char *)0x0) {
        va[0].overflow_arg_area = local_248;
        va[0]._0_8_ = &stack0x00000008;
        ansi._4_4_ = 0x30;
        ansi._0_4_ = 0x18;
        local_194 = vsnprintf((char *)&msg.clen,0x100,fmt,&ansi);
        if (0 < local_194) {
          if (0x100 < local_194) {
            local_194 = 0x100;
          }
          _ret = &msg.clen;
          cont.iov_base = (void *)(long)local_194;
          msg.base = &ret;
          msg.cont = (iovec *)0x1;
        }
      }
      rc_local._4_4_ = (*rc->_vptr->reply)(rc,(mpt_message *)&cont.iov_len);
      if (-1 < rc_local._4_4_) {
        rc_local._4_4_ = 0;
      }
    }
  }
  return rc_local._4_4_;
}

Assistant:

extern int mpt_context_reply(MPT_INTERFACE(reply_context) *rc, int code, const char *fmt, ...)
{
	va_list va;
	
	if (code < CHAR_MIN || code > CHAR_MAX) {
		return MPT_ERROR(BadArgument);
	}
	if (!rc) {
		const char *ansi = 0, *desc;
		
		if (!fmt) {
			return 0;
		}
		if (!code) {
			code = MPT_LOG(Debug);
		}
		else if (code > 0) {
			code = MPT_LOG(Info);
		}
		else {
			code = MPT_LOG(Error);
		}
		if ((isatty(fileno(stderr)) > 0) && (ansi = mpt_ansi_code(code))) {
			fputs(ansi, stderr);
		}
		fputc('[', stderr);
		if (!ansi && (desc = mpt_log_identifier(code))) {
			fputs(desc, stderr);
		}
		fputc('>', stderr);
		fputc(']', stderr);
		fputc(' ', stderr);
		
		if (ansi) {
			fputs(mpt_ansi_reset(), stderr);
		}
		va_start(va, fmt);
		vfprintf(stderr, fmt, va);
		va_end(va);
		fputc('\n', stderr);
		
		return 1;
	}
	else {
		char buf[256];
		MPT_STRUCT(message) msg;
		struct iovec cont;
		MPT_STRUCT(msgtype) mt;
		int ret;
		
		mt.cmd = MPT_MESGTYPE(Answer);
		mt.arg = code;
		
		msg.base = &mt;
		msg.used = sizeof(mt);
		msg.clen = 0;
		
		if (fmt) {
			int len;
			va_start(va, fmt);
			len = vsnprintf(buf, sizeof(buf), fmt, va);
			va_end(va);
			if (len > 0) {
				if (len > (int) sizeof(buf)) {
					len = sizeof(buf);
					buf[len-1] = 0;
				}
				cont.iov_base = buf;
				cont.iov_len  = len;
				msg.cont = &cont;
				msg.clen = 1;
			}
		}
		if ((ret = rc->_vptr->reply(rc, &msg)) < 0) {
			return ret;
		}
		return 0;
	}
}